

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_test.cpp
# Opt level: O0

void testDefaultHelp_SingleValueOptionAdded_ShouldSucceed(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  __type _Var1;
  string answer;
  stringstream ss;
  Argengine ae;
  anon_class_1_0_00000001 *in_stack_fffffffffffffbe8;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffffbf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  allocator_type *in_stack_fffffffffffffc08;
  allocator<char> *in_stack_fffffffffffffc10;
  iterator in_stack_fffffffffffffc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc28;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc30;
  iterator in_stack_fffffffffffffc38;
  size_type in_stack_fffffffffffffc40;
  string *psVar2;
  string *local_3b8;
  string *local_368;
  string local_348 [39];
  allocator<char> local_321;
  string local_320 [39];
  allocator<char> local_2f9;
  string local_2f8 [39];
  allocator<char> local_2d1;
  string local_2d0 [40];
  undefined1 local_2a8 [37];
  undefined1 local_283;
  allocator<char> local_282;
  allocator<char> local_281;
  string *local_280;
  string local_278 [32];
  undefined1 local_258 [32];
  string *local_238;
  undefined8 local_230;
  undefined1 local_228 [48];
  stringstream local_1f8 [395];
  undefined1 local_6d;
  allocator<char> local_59;
  string *local_58;
  string local_50 [32];
  string *local_30;
  undefined8 local_28;
  undefined1 local_20 [24];
  Argengine local_8 [8];
  
  local_6d = 1;
  local_58 = local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
  local_6d = 0;
  local_30 = local_50;
  local_28 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x108d73);
  __l._M_len = (size_type)in_stack_fffffffffffffc20;
  __l._M_array = in_stack_fffffffffffffc18;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffc10,__l,in_stack_fffffffffffffc08);
  juzzlin::Argengine::Argengine(local_8,local_20,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffbf0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x108dd0);
  local_368 = (string *)&local_30;
  do {
    local_368 = local_368 + -0x20;
    std::__cxx11::string::~string(local_368);
  } while (local_368 != local_50);
  std::allocator<char>::~allocator(&local_59);
  std::__cxx11::stringstream::stringstream(local_1f8);
  local_283 = 1;
  local_280 = local_278;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
  local_280 = (string *)local_258;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
  local_283 = 0;
  local_238 = local_278;
  local_230 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x108f15);
  __l_00._M_len = in_stack_fffffffffffffc40;
  __l_00._M_array = in_stack_fffffffffffffc38;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_fffffffffffffc30,__l_00,in_stack_fffffffffffffc28,
        (allocator_type *)in_stack_fffffffffffffc20);
  std::function<void(std::__cxx11::string)>::
  function<testDefaultHelp_SingleValueOptionAdded_ShouldSucceed()::__0,void>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
  juzzlin::Argengine::addOption(local_8,local_228,local_2a8,0,local_2d0,local_2f8);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)0x10902b);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x109038);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x109045);
  psVar2 = local_278;
  local_3b8 = (string *)&local_238;
  do {
    local_3b8 = local_3b8 + -0x20;
    std::__cxx11::string::~string(local_3b8);
  } while (local_3b8 != psVar2);
  std::allocator<char>::~allocator(&local_282);
  std::allocator<char>::~allocator(&local_281);
  juzzlin::Argengine::setOutputStream((ostream *)local_8);
  juzzlin::Argengine::printHelp();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
  std::allocator<char>::~allocator(&local_321);
  std::__cxx11::stringstream::str();
  _Var1 = std::operator==(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  if (!_Var1) {
    __assert_fail("ss.str() == answer",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/help_test/help_test.cpp"
                  ,0x66,"void testDefaultHelp_SingleValueOptionAdded_ShouldSucceed()");
  }
  std::__cxx11::string::~string(local_348);
  std::__cxx11::string::~string(local_320);
  std::__cxx11::stringstream::~stringstream(local_1f8);
  juzzlin::Argengine::~Argengine(local_8);
  return;
}

Assistant:

void testDefaultHelp_SingleValueOptionAdded_ShouldSucceed()
{
    Argengine ae({ "test" });
    std::stringstream ss;
    ae.addOption(
      { "-f", "--foo" }, [](std::string) {}, false, "Add foo.", "FOO");
    ae.setOutputStream(ss);
    ae.printHelp();
    const std::string answer = "Usage: test [OPTIONS]\n\n"
                               "Options:\n\n"
                               "-h, --help       Show this help.\n"
                               "-f, --foo [FOO]  Add foo.\n\n";
    assert(ss.str() == answer);
}